

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O1

uint32_t sse::Sum(uint32_t rowSize,uint8_t *imageY,uint8_t *imageYEnd,uint32_t simdWidth,
                 uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  bool bVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  uint8_t *puVar6;
  ulong uVar7;
  ushort uVar8;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  uint uVar19;
  undefined1 auVar20 [64];
  undefined1 auVar9 [16];
  
  if (imageY == imageYEnd) {
    uVar19 = 0;
    auVar17 = (undefined1  [16])0x0;
  }
  else {
    auVar12 = vpbroadcastq_avx512f();
    puVar6 = imageY + totalSimdWidth;
    uVar19 = 0;
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    do {
      if (simdWidth != 0) {
        lVar5 = 0;
        do {
          auVar17 = vpmovzxbw_avx(*(undefined1 (*) [16])(imageY + lVar5));
          auVar9 = vpunpckhbw_avx(*(undefined1 (*) [16])(imageY + lVar5),(undefined1  [16])0x0);
          auVar17 = vpaddw_avx(auVar17,auVar9);
          auVar9 = vpmovzxwd_avx(auVar17);
          auVar17 = vpunpckhwd_avx(auVar17,(undefined1  [16])0x0);
          auVar17 = vpaddd_avx(auVar18._0_16_,auVar17);
          auVar17 = vpaddd_avx(auVar17,auVar9);
          auVar18 = ZEXT1664(auVar17);
          lVar5 = lVar5 + 0x10;
        } while ((ulong)simdWidth << 4 != lVar5);
      }
      auVar17 = auVar18._0_16_;
      if (nonSimdWidth != 0) {
        auVar20 = ZEXT464(uVar19);
        uVar7 = 0;
        do {
          auVar15 = vmovdqa64_avx512f(auVar20);
          auVar20 = vpbroadcastq_avx512f();
          auVar16 = vporq_avx512f(auVar20,auVar13);
          auVar20 = vporq_avx512f(auVar20,auVar14);
          uVar2 = vpcmpuq_avx512f(auVar20,auVar12,2);
          bVar3 = (byte)uVar2;
          uVar2 = vpcmpuq_avx512f(auVar16,auVar12,2);
          bVar4 = (byte)uVar2;
          uVar8 = CONCAT11(bVar4,bVar3);
          auVar9 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(puVar6 + uVar7));
          auVar10[1] = ((byte)(uVar8 >> 1) & 1) * auVar9[1];
          auVar10[0] = (bVar3 & 1) * auVar9[0];
          auVar10[2] = ((byte)(uVar8 >> 2) & 1) * auVar9[2];
          auVar10[3] = ((byte)(uVar8 >> 3) & 1) * auVar9[3];
          auVar10[4] = ((byte)(uVar8 >> 4) & 1) * auVar9[4];
          auVar10[5] = ((byte)(uVar8 >> 5) & 1) * auVar9[5];
          auVar10[6] = ((byte)(uVar8 >> 6) & 1) * auVar9[6];
          auVar10[7] = ((byte)(uVar8 >> 7) & 1) * auVar9[7];
          auVar10[8] = (bVar4 & 1) * auVar9[8];
          auVar10[9] = (bVar4 >> 1 & 1) * auVar9[9];
          auVar10[10] = (bVar4 >> 2 & 1) * auVar9[10];
          auVar10[0xb] = (bVar4 >> 3 & 1) * auVar9[0xb];
          auVar10[0xc] = (bVar4 >> 4 & 1) * auVar9[0xc];
          auVar10[0xd] = (bVar4 >> 5 & 1) * auVar9[0xd];
          auVar10[0xe] = (bVar4 >> 6 & 1) * auVar9[0xe];
          auVar10[0xf] = -((char)bVar4 >> 7) * auVar9[0xf];
          auVar20 = vpmovzxbd_avx512f(auVar10);
          auVar20 = vpaddd_avx512f(auVar15,auVar20);
          uVar7 = uVar7 + 0x10;
        } while (((ulong)nonSimdWidth + 0xf & 0xfffffffffffffff0) != uVar7);
        auVar20 = vmovdqa32_avx512f(auVar20);
        auVar16._0_4_ = (uint)(bVar3 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar15._0_4_
        ;
        bVar1 = (bool)((byte)(uVar8 >> 1) & 1);
        auVar16._4_4_ = (uint)bVar1 * auVar20._4_4_ | (uint)!bVar1 * auVar15._4_4_;
        bVar1 = (bool)((byte)(uVar8 >> 2) & 1);
        auVar16._8_4_ = (uint)bVar1 * auVar20._8_4_ | (uint)!bVar1 * auVar15._8_4_;
        bVar1 = (bool)((byte)(uVar8 >> 3) & 1);
        auVar16._12_4_ = (uint)bVar1 * auVar20._12_4_ | (uint)!bVar1 * auVar15._12_4_;
        bVar1 = (bool)((byte)(uVar8 >> 4) & 1);
        auVar16._16_4_ = (uint)bVar1 * auVar20._16_4_ | (uint)!bVar1 * auVar15._16_4_;
        bVar1 = (bool)((byte)(uVar8 >> 5) & 1);
        auVar16._20_4_ = (uint)bVar1 * auVar20._20_4_ | (uint)!bVar1 * auVar15._20_4_;
        bVar1 = (bool)((byte)(uVar8 >> 6) & 1);
        auVar16._24_4_ = (uint)bVar1 * auVar20._24_4_ | (uint)!bVar1 * auVar15._24_4_;
        bVar1 = (bool)((byte)(uVar8 >> 7) & 1);
        auVar16._28_4_ = (uint)bVar1 * auVar20._28_4_ | (uint)!bVar1 * auVar15._28_4_;
        auVar16._32_4_ =
             (uint)(bVar4 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar15._32_4_;
        bVar1 = (bool)(bVar4 >> 1 & 1);
        auVar16._36_4_ = (uint)bVar1 * auVar20._36_4_ | (uint)!bVar1 * auVar15._36_4_;
        bVar1 = (bool)(bVar4 >> 2 & 1);
        auVar16._40_4_ = (uint)bVar1 * auVar20._40_4_ | (uint)!bVar1 * auVar15._40_4_;
        bVar1 = (bool)(bVar4 >> 3 & 1);
        auVar16._44_4_ = (uint)bVar1 * auVar20._44_4_ | (uint)!bVar1 * auVar15._44_4_;
        bVar1 = (bool)(bVar4 >> 4 & 1);
        auVar16._48_4_ = (uint)bVar1 * auVar20._48_4_ | (uint)!bVar1 * auVar15._48_4_;
        bVar1 = (bool)(bVar4 >> 5 & 1);
        auVar16._52_4_ = (uint)bVar1 * auVar20._52_4_ | (uint)!bVar1 * auVar15._52_4_;
        bVar1 = (bool)(bVar4 >> 6 & 1);
        auVar16._56_4_ = (uint)bVar1 * auVar20._56_4_ | (uint)!bVar1 * auVar15._56_4_;
        auVar16._60_4_ =
             (uint)(bVar4 >> 7) * auVar20._60_4_ | (uint)!(bool)(bVar4 >> 7) * auVar15._60_4_;
        auVar11 = vextracti64x4_avx512f(auVar16,1);
        auVar20 = vpaddd_avx512f(auVar16,ZEXT3264(auVar11));
        auVar9 = vpaddd_avx(auVar20._0_16_,auVar20._16_16_);
        auVar10 = vpshufd_avx(auVar9,0xee);
        auVar9 = vpaddd_avx(auVar9,auVar10);
        auVar10 = vpshufd_avx(auVar9,0x55);
        auVar9 = vpaddd_avx(auVar9,auVar10);
        uVar19 = auVar9._0_4_;
      }
      imageY = imageY + rowSize;
      puVar6 = puVar6 + rowSize;
    } while (imageY != imageYEnd);
  }
  auVar17 = vphaddd_avx(auVar17,auVar17);
  auVar17 = vphaddd_avx(auVar17,auVar17);
  return auVar17._0_4_ + uVar19;
}

Assistant:

uint32_t Sum( uint32_t rowSize, const uint8_t * imageY, const uint8_t * imageYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        uint32_t sum = 0;
        simd simdSum = _mm_setzero_si128();
        simd zero    = _mm_setzero_si128();

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const simd * src    = reinterpret_cast <const simd*> (imageY);
            const simd * srcEnd = src + simdWidth;

            for( ; src != srcEnd; ++src ) {
                simd data = _mm_loadu_si128( src );

                simd dataLo  = _mm_unpacklo_epi8( data, zero );
                simd dataHi  = _mm_unpackhi_epi8( data, zero );
                simd sumLoHi = _mm_add_epi16( dataLo, dataHi );

                simdSum = _mm_add_epi32( simdSum, _mm_add_epi32( _mm_unpacklo_epi16( sumLoHi, zero ),
                                                                 _mm_unpackhi_epi16( sumLoHi, zero ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageX    = imageY + totalSimdWidth;
                const uint8_t * imageXEnd = imageX + nonSimdWidth;

                for( ; imageX != imageXEnd; ++imageX )
                    sum += (*imageX);
            }
        }

        uint32_t output[4] ={ 0 };

        _mm_storeu_si128( reinterpret_cast <simd*>(output), simdSum );

        return sum + output[0] + output[1] + output[2] + output[3];
    }